

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

void __thiscall rsg::ConstructorOp::~ConstructorOp(ConstructorOp *this)

{
  pointer pSVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__ConstructorOp_00d30788;
  ppEVar3 = (this->m_inputExpressions).
            super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar2 = (this->m_inputExpressions).
            super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar3 != ppEVar2) {
    do {
      if (*ppEVar3 != (Expression *)0x0) {
        (*(*ppEVar3)->_vptr_Expression[1])();
        ppEVar2 = (this->m_inputExpressions).
                  super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      ppEVar3 = ppEVar3 + 1;
    } while (ppEVar3 != ppEVar2);
    ppEVar3 = (this->m_inputExpressions).
              super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppEVar3 != (pointer)0x0) {
    operator_delete(ppEVar3,(long)(this->m_inputExpressions).
                                  super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar3
                   );
  }
  std::vector<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>::~vector(&this->m_inputValueRanges)
  ;
  pSVar1 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1,(long)(this->m_value).m_value.
                                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1);
  }
  ValueRange::~ValueRange(&this->m_valueRange);
  return;
}

Assistant:

ConstructorOp::~ConstructorOp (void)
{
	for (vector<Expression*>::iterator i = m_inputExpressions.begin(); i != m_inputExpressions.end(); i++)
		delete *i;
}